

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

iterator * __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>::end
          (iterator *__return_storage_ptr__,
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>_>
          *this)

{
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int> GStack_88;
  
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
            (&GStack_88,&this->source);
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::GroupByState
            (&__return_storage_ptr__->source,&GStack_88);
  __return_storage_ptr__->valid = false;
  GroupByState<linq::IEnumerableCore<linq::IEnumerable<int>_>,_bool,_int>::~GroupByState(&GStack_88)
  ;
  return __return_storage_ptr__;
}

Assistant:

iterator end() { return iterator(source, false); }